

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O2

Qiniu_Error Qiniu_Qetag_allocateBlock(_Qiniu_Qetag_Context *ctx,_Qiniu_Qetag_Block **blk)

{
  ushort uVar1;
  Qiniu_Error QVar2;
  Qiniu_Digest *pQVar3;
  ushort uVar4;
  ushort uVar5;
  Qiniu_Error QVar6;
  
  if (ctx->blkUnused == 0) {
    QVar6 = Qiniu_Qetag_mergeBlocks(ctx);
    if (QVar6.code != 200) {
      return QVar6;
    }
    if (ctx->blkUnused == 0) {
      *blk = (_Qiniu_Qetag_Block *)0x0;
      QVar6.message = "no enough blocks";
      QVar6._0_8_ = 0x2707;
      return QVar6;
    }
  }
  uVar1 = ctx->blkEnd;
  pQVar3 = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
  ctx->blkArray[uVar1].sha1Digest = pQVar3;
  if (pQVar3 == (Qiniu_Digest *)0x0) {
    QVar2.message = "openssl internal error";
    QVar2._0_8_ = 9999;
  }
  else {
    ctx->blkArray[uVar1].field_0 =
         (anon_struct_4_3_eb54787e_for__Qiniu_Qetag_Block_0)
         ((uint)(byte)ctx->blkArray[uVar1].field_0.field_0x3 << 0x18 | 0x400000);
    ctx->blkUnused = ctx->blkUnused - 1;
    uVar4 = ctx->blkEnd + 1;
    uVar5 = 0;
    if (uVar4 < ctx->blkElementCount) {
      uVar5 = uVar4;
    }
    ctx->blkEnd = uVar5;
    *blk = ctx->blkArray + uVar1;
    QVar2.message = "ok";
    QVar2._0_8_ = 200;
  }
  return QVar2;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_allocateBlock(struct _Qiniu_Qetag_Context * ctx, struct _Qiniu_Qetag_Block ** blk)
{
    Qiniu_Error err;
    struct _Qiniu_Qetag_Block * newBlk = NULL;

    if (ctx->blkUnused == 0) {
        err = Qiniu_Qetag_mergeBlocks(ctx);
        if (err.code != 200) {
            return err;
        }

        if (ctx->blkUnused == 0) {
            *blk = NULL;
            err.code = 9991;
            err.message = "no enough blocks";
            return err;
        } // if
    } // if

    newBlk = &ctx->blkArray[ctx->blkEnd];
	newBlk->sha1Digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
	if (newBlk->sha1Digest == NULL) {
		err.code = 9999;
		err.message = "openssl internal error";
		return err;
	}

    newBlk->done = NO;
    newBlk->capacity = BLOCK_MAX_SIZE;

    ctx->blkUnused -= 1;
    ctx->blkEnd += 1;
    if (ctx->blkEnd >= ctx->blkElementCount) {
        ctx->blkEnd = 0;
    }

    *blk = newBlk;
    err.code = 200;
    err.message = "ok";
    return err;
}